

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O2

FilePath * testing::internal::FilePath::GetCurrentDir(void)

{
  char *pcVar1;
  char *pcVar2;
  FilePath *in_RDI;
  char local_1048 [8];
  char cwd [4097];
  allocator local_19;
  
  memset(local_1048,0,0x1001);
  pcVar1 = getcwd(local_1048,0x1001);
  pcVar2 = "";
  if (pcVar1 != (char *)0x0) {
    pcVar2 = local_1048;
  }
  std::__cxx11::string::string((string *)(cwd + 0x1000),pcVar2,&local_19);
  FilePath(in_RDI,(string *)(cwd + 0x1000));
  std::__cxx11::string::~string((string *)(cwd + 0x1000));
  return in_RDI;
}

Assistant:

FilePath FilePath::GetCurrentDir() {
#if GTEST_OS_WINDOWS_MOBILE || GTEST_OS_WINDOWS_PHONE || \
    GTEST_OS_WINDOWS_RT || ARDUINO || defined(ESP_PLATFORM)
  // These platforms do not have a current directory, so we just return
  // something reasonable.
  return FilePath(kCurrentDirectoryString);
#elif GTEST_OS_WINDOWS
  char cwd[GTEST_PATH_MAX_ + 1] = { '\0' };
  return FilePath(_getcwd(cwd, sizeof(cwd)) == nullptr ? "" : cwd);
#else
  char cwd[GTEST_PATH_MAX_ + 1] = { '\0' };
  char* result = getcwd(cwd, sizeof(cwd));
# if GTEST_OS_NACL
  // getcwd will likely fail in NaCl due to the sandbox, so return something
  // reasonable. The user may have provided a shim implementation for getcwd,
  // however, so fallback only when failure is detected.
  return FilePath(result == nullptr ? kCurrentDirectoryString : cwd);
# endif  // GTEST_OS_NACL
  return FilePath(result == nullptr ? "" : cwd);
#endif  // GTEST_OS_WINDOWS_MOBILE
}